

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

bool __thiscall
pybind11::detail::
type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_void>
::load(type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_void>
       *this,handle src,bool convert)

{
  bool bVar1;
  Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *this_00;
  Scalar *dataPtr;
  Index outer;
  Index IVar2;
  pointer __p;
  type expr;
  OuterStride<_1> local_108;
  PyObject *local_f8;
  EigenConformable<true> local_f0;
  PyObject *local_c0;
  handle local_b8;
  Array copy;
  EigenConformable<true> local_a0;
  PyObject *local_70;
  handle local_68;
  Array aref;
  EigenConformable<true> fits;
  byte local_22;
  bool need_copy;
  bool convert_local;
  type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_void>
  *this_local;
  handle src_local;
  
  fits._40_8_ = src.m_ptr;
  bVar1 = isinstance<pybind11::array_t<double,_17>,_0>(src);
  local_22 = (bVar1 ^ 0xffU) & 1;
  EigenConformable<true>::EigenConformable((EigenConformable<true> *)&aref,false);
  if (local_22 == 0) {
    local_70 = src.m_ptr;
    reinterpret_borrow<pybind11::array_t<double,17>>((pybind11 *)&local_68,src);
    bVar1 = handle::operator_cast_to_bool(&local_68);
    if (bVar1) {
      EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
      ::conformable(&local_a0,(array *)&local_68);
      memcpy(&aref,&local_a0,0x29);
      bVar1 = EigenConformable::operator_cast_to_bool((EigenConformable *)&aref);
      if (bVar1) {
        bVar1 = EigenConformable<true>::
                stride_compatible<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>>
                          ((EigenConformable<true> *)&aref);
        if (bVar1) {
          array_t<double,_17>::operator=(&this->copy_or_ref,(array_t<double,_17> *)&local_68);
        }
        else {
          local_22 = 1;
        }
        goto LAB_0048ccda;
      }
      src_local.m_ptr._7_1_ = 0;
      copy.super_array.super_buffer.super_object.super_handle.m_ptr._0_4_ = 1;
    }
    else {
      local_22 = 1;
LAB_0048ccda:
      copy.super_array.super_buffer.super_object.super_handle.m_ptr._0_4_ = 0;
    }
    array_t<double,_17>::~array_t((array_t<double,_17> *)&local_68);
    if ((int)copy.super_array.super_buffer.super_object.super_handle.m_ptr != 0) goto LAB_0048cfd4;
  }
  if (local_22 != 0) {
    if (!convert) {
      src_local.m_ptr._7_1_ = 0;
      goto LAB_0048cfd4;
    }
    local_c0 = src.m_ptr;
    array_t<double,_17>::ensure((array_t<double,_17> *)&local_b8,src);
    bVar1 = handle::operator_cast_to_bool(&local_b8);
    if (bVar1) {
      EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
      ::conformable(&local_f0,(array *)&local_b8);
      memcpy(&aref,&local_f0,0x29);
      bVar1 = EigenConformable::operator_cast_to_bool((EigenConformable *)&aref);
      if ((bVar1) &&
         (bVar1 = EigenConformable<true>::
                  stride_compatible<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>>
                            ((EigenConformable<true> *)&aref), bVar1)) {
        array_t<double,_17>::operator=(&this->copy_or_ref,(array_t<double,_17> *)&local_b8);
        local_f8 = (this->copy_or_ref).super_array.super_buffer.super_object.super_handle.m_ptr;
        loader_life_support::add_patient((handle)local_f8);
        copy.super_array.super_buffer.super_object.super_handle.m_ptr._0_4_ = 0;
      }
      else {
        src_local.m_ptr._7_1_ = 0;
        copy.super_array.super_buffer.super_object.super_handle.m_ptr._0_4_ = 1;
      }
    }
    else {
      src_local.m_ptr._7_1_ = 0;
      copy.super_array.super_buffer.super_object.super_handle.m_ptr._0_4_ = 1;
    }
    array_t<double,_17>::~array_t((array_t<double,_17> *)&local_b8);
    if ((int)copy.super_array.super_buffer.super_object.super_handle.m_ptr != 0) goto LAB_0048cfd4;
  }
  std::
  unique_ptr<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
  ::reset(&this->ref,(pointer)0x0);
  this_00 = (Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *)
            operator_new(0x28);
  dataPtr = data<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                      (this,&this->copy_or_ref);
  outer = Eigen::Stride<-1,_-1>::outer((Stride<_1,__1> *)&fits.cols);
  IVar2 = Eigen::Stride<-1,_-1>::inner((Stride<_1,__1> *)&fits.cols);
  make_stride<Eigen::OuterStride<_1>,_0>(&local_108,outer,IVar2);
  Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>::Map
            (this_00,dataPtr,fits._0_8_,fits.rows,&local_108);
  std::
  unique_ptr<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
  ::reset(&this->map,this_00);
  __p = (pointer)operator_new(0x38);
  expr = std::
         unique_ptr<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
         ::operator*(&this->map);
  Eigen::Ref<Eigen::Matrix<double,-1,3,1,-1,3>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Map<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            ((Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>> *)__p,
             (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
              *)expr,(type *)0x0);
  std::
  unique_ptr<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
  ::reset(&this->ref,__p);
  src_local.m_ptr._7_1_ = 1;
LAB_0048cfd4:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        // First check whether what we have is already an array of the right type.  If not, we can't
        // avoid a copy (because the copy is also going to do type conversion).
        bool need_copy = !isinstance<Array>(src);

        EigenConformable<props::row_major> fits;
        if (!need_copy) {
            // We don't need a converting copy, but we also need to check whether the strides are
            // compatible with the Ref's stride requirements
            Array aref = reinterpret_borrow<Array>(src);

            if (aref && (!need_writeable || aref.writeable())) {
                fits = props::conformable(aref);
                if (!fits) return false; // Incompatible dimensions
                if (!fits.template stride_compatible<props>())
                    need_copy = true;
                else
                    copy_or_ref = std::move(aref);
            }
            else {
                need_copy = true;
            }
        }

        if (need_copy) {
            // We need to copy: If we need a mutable reference, or we're not supposed to convert
            // (either because we're in the no-convert overload pass, or because we're explicitly
            // instructed not to copy (via `py::arg().noconvert()`) we have to fail loading.
            if (!convert || need_writeable) return false;

            Array copy = Array::ensure(src);
            if (!copy) return false;
            fits = props::conformable(copy);
            if (!fits || !fits.template stride_compatible<props>())
                return false;
            copy_or_ref = std::move(copy);
            loader_life_support::add_patient(copy_or_ref);
        }

        ref.reset();
        map.reset(new MapType(data(copy_or_ref), fits.rows, fits.cols, make_stride(fits.stride.outer(), fits.stride.inner())));
        ref.reset(new Type(*map));

        return true;
    }